

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2skin.cpp
# Opt level: O0

Stream * rw::ps2::writeNativeSkin(Stream *stream,int32 len,void *object,int32 offset)

{
  Skin *skin_00;
  undefined1 local_48 [8];
  uint32 buffer [4];
  bool oldFormat;
  Skin *skin;
  uint8 header [4];
  int32 offset_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  skin._4_4_ = offset;
  _header = object;
  writeChunkHeader(stream,1,len + -0xc);
  Stream::writeU32(stream,4);
  skin_00 = *(Skin **)((long)_header + (long)skin._4_4_);
  buffer[3]._3_1_ = version < 0x34000;
  skin._0_1_ = (undefined1)skin_00->numBones;
  if ((bool)buffer[3]._3_1_) {
    skin._1_1_ = 0;
    skin._2_1_ = 0;
  }
  else {
    skin._1_1_ = (undefined1)skin_00->numUsedBones;
    skin._2_1_ = (undefined1)skin_00->numWeights;
  }
  skin._3_1_ = 0;
  (*stream->_vptr_Stream[3])(stream,&skin,4);
  if ((buffer[3]._3_1_ & 1) == 0) {
    (*stream->_vptr_Stream[3])(stream,skin_00->usedBones,(ulong)(uint)skin_00->numUsedBones);
  }
  Stream::write32(stream,skin_00->inverseMatrices,skin_00->numBones << 6);
  if ((buffer[3]._3_1_ & 1) == 0) {
    memset(local_48,0,0x10);
    Stream::write32(stream,local_48,0x10);
    writeSkinSplitData(stream,skin_00);
  }
  return stream;
}

Assistant:

Stream*
writeNativeSkin(Stream *stream, int32 len, void *object, int32 offset)
{
	uint8 header[4];

	writeChunkHeader(stream, ID_STRUCT, len-12);
	stream->writeU32(PLATFORM_PS2);
	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	// not sure which version introduced the new format
	bool oldFormat = version < 0x34000;
	header[0] = skin->numBones;
	if(oldFormat){
		header[1] = 0;
		header[2] = 0;
	}else{
		header[1] = skin->numUsedBones;
		header[2] = skin->numWeights;
	}
	header[3] = 0;
	stream->write8(header, 4);

	if(!oldFormat)
		stream->write8(skin->usedBones, skin->numUsedBones);
	stream->write32(skin->inverseMatrices, skin->numBones*64);
	if(!oldFormat){
		uint32 buffer[4] = { 0, 0, 0, 0, };
		stream->write32(buffer, 4*4);

		writeSkinSplitData(stream, skin);
	}
	return stream;
}